

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

float __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<float,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int *piVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  unsigned_fast_type uVar9;
  int iVar10;
  value_type_conflict *x;
  limb_type lm_mask;
  int iVar11;
  bool bVar12;
  float fVar13;
  local_unsigned_wide_integer_type u;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar2 = *(int *)(this + 0x1c);
  local_48 = *(undefined8 *)(this + 0x10);
  uStack_40 = *(undefined8 *)(this + 0x18);
  local_58 = *(undefined8 *)this;
  uStack_50 = *(undefined8 *)(this + 8);
  if (iVar2 < 0) {
    lVar8 = 0;
    do {
      *(uint *)((long)&local_58 + lVar8) = ~*(uint *)((long)&local_58 + lVar8);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x20);
    lVar8 = 0;
    do {
      piVar1 = (int *)((long)&local_58 + lVar8);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar12 = lVar8 != 0x1c;
      lVar8 = lVar8 + 4;
    } while (bVar12);
  }
  x = (value_type_conflict *)&local_38;
  local_28 = local_48;
  uStack_20 = uStack_40;
  local_38 = local_58;
  uStack_30 = uStack_50;
  uVar9 = msb<256u,unsigned_int,void,false>((uintwide_t<256U,_unsigned_int,_void,_false> *)x);
  uVar6 = (int)uVar9 + 1;
  iVar10 = (uint)((uVar6 & 0x1f) != 0) + (uVar6 >> 5);
  if (iVar10 == 0) {
    fVar13 = 0.0;
  }
  else {
    iVar7 = 0;
    fVar5 = 1.0;
    fVar13 = 0.0;
    do {
      uVar6 = 1;
      iVar11 = 0x20;
      fVar4 = 0.0;
      do {
        fVar3 = fVar4 + fVar5;
        if ((*x & uVar6) == 0) {
          fVar3 = fVar4;
        }
        uVar6 = uVar6 * 2;
        fVar5 = fVar5 + fVar5;
        iVar11 = iVar11 + -1;
        fVar4 = fVar3;
      } while (iVar11 != 0);
      fVar13 = fVar13 + fVar3;
      x = x + 1;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar10);
  }
  if (iVar2 < 0) {
    fVar13 = -fVar13;
  }
  return fVar13;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }